

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AppendToken(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
              *this,Ch *str,SizeType len)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  
  this_00 = &this->documentStack_;
  uVar3 = (ulong)(len * 2 + 1);
  if ((long)(this->documentStack_).stackEnd_ - (long)(this->documentStack_).stackTop_ < (long)uVar3)
  {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,uVar3);
  }
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
  *pcVar2 = '/';
  if (len != 0) {
    uVar3 = 0;
    do {
      cVar1 = str[uVar3];
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
      if (cVar1 == '/') {
        *pcVar2 = '~';
        pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
        *pcVar2 = '1';
      }
      else if (cVar1 == '~') {
        *pcVar2 = '~';
        pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
        *pcVar2 = '0';
      }
      else {
        *pcVar2 = cVar1;
      }
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return;
}

Assistant:

void AppendToken(const Ch* str, SizeType len) {
        documentStack_.template Reserve<Ch>(1 + len * 2); // worst case all characters are escaped as two characters
        *documentStack_.template PushUnsafe<Ch>() = '/';
        for (SizeType i = 0; i < len; i++) {
            if (str[i] == '~') {
                *documentStack_.template PushUnsafe<Ch>() = '~';
                *documentStack_.template PushUnsafe<Ch>() = '0';
            }
            else if (str[i] == '/') {
                *documentStack_.template PushUnsafe<Ch>() = '~';
                *documentStack_.template PushUnsafe<Ch>() = '1';
            }
            else
                *documentStack_.template PushUnsafe<Ch>() = str[i];
        }
    }